

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeThread.c
# Opt level: O0

void * asyncWrite(void *parameters)

{
  _Bool _Var1;
  int iVar2;
  int_fast32_t write_fd;
  chunk *pcVar3;
  bool bVar4;
  long local_48;
  uint64_t write_progress;
  uint64_t bytes_to_write;
  uint64_t bytes_written;
  chunk *write_chunk;
  int64_t write;
  writeParams *params;
  void *parameters_local;
  
  write_fd = openForWrite(*(uint8_t **)((long)parameters + 0x30));
  if (write_fd < 0) {
    **(undefined4 **)((long)parameters + 0x18) = 0xfffffffd;
  }
  else {
    bytes_written = 0;
    bytes_to_write = 0;
    local_48 = 0;
    while( true ) {
      bVar4 = false;
      if ((**(byte **)((long)parameters + 8) & 1) != 0) {
        bVar4 = **(int **)((long)parameters + 0x18) == 0;
      }
      if (!bVar4) goto LAB_0010976e;
      if (bytes_written == 0) {
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x20));
        pcVar3 = front(*(queue **)((long)parameters + 0x28));
        if ((pcVar3 != (chunk *)0x0) &&
           (bytes_written = (uint64_t)front(*(queue **)((long)parameters + 0x28)),
           (chunk *)bytes_written != (chunk *)0x0)) {
          deque(*(queue **)((long)parameters + 0x28));
        }
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x20));
      }
      if (((bytes_written != 0) && (*(char *)bytes_written == '\x05')) ||
         ((*(long *)((long)parameters + 0x38) != 0 &&
          (((**(byte **)((long)parameters + 0x10) & 1) != 0 &&
           (**(ulong **)((long)parameters + 0x38) <= bytes_to_write)))))) break;
      if ((bytes_written != 0) && (*(long *)(bytes_written + 8) != 0)) {
        if (*(long *)((long)parameters + 0x38) == 0) {
          write_progress = *(uint64_t *)(bytes_written + 0x10);
        }
        else if (**(ulong **)((long)parameters + 0x38) <
                 bytes_to_write + *(long *)(bytes_written + 0x10)) {
          write_progress = **(long **)((long)parameters + 0x38) - bytes_to_write;
        }
        else {
          write_progress = *(uint64_t *)(bytes_written + 0x10);
        }
        local_48 = *(long *)(bytes_written + 0x10) + local_48;
        _Var1 = writeBytes(*(uint8_t **)(bytes_written + 8),write_progress,write_fd);
        if (!_Var1) {
          **(undefined4 **)((long)parameters + 0x18) = 0xfffffffd;
          close((int)write_fd);
          goto LAB_0010976e;
        }
        bytes_to_write = write_progress + bytes_to_write;
        destroyChunk((chunk *)bytes_written);
        bytes_written = 0;
      }
      if ((local_48 != 0) &&
         (iVar2 = pthread_mutex_trylock
                            (*(pthread_mutex_t **)(*(long *)((long)parameters + 0x40) + 8)),
         iVar2 == 0)) {
        *(long *)(*(long *)((long)parameters + 0x40) + 0x18) =
             local_48 + *(long *)(*(long *)((long)parameters + 0x40) + 0x18);
        local_48 = 0;
        pthread_mutex_unlock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x40) + 8));
      }
    }
    destroyChunk((chunk *)bytes_written);
LAB_0010976e:
    close((int)write_fd);
    if (**(int **)((long)parameters + 0x18) == 0) {
      if ((*(byte *)(*parameters + 0x3c) >> 5 & 1) == 0) {
        rename(*(char **)((long)parameters + 0x30),*(char **)(*parameters + 0x18));
      }
      else {
        rename(*(char **)((long)parameters + 0x30),*(char **)(*parameters + 0x10));
      }
      **(undefined1 **)((long)parameters + 8) = 0;
    }
  }
  return (void *)0x0;
}

Assistant:

void* asyncWrite(void* parameters)
{
    pdebug("asyncWrite()\n");
    writeParams* params = parameters;
    int64_t write = openForWrite(params->temp_file_name);

    if(write < 0)
    {
        pdebug("Error opening file for write\n");
        *(params->error) = FILE_IO_FAIL;

        return NULL;
    }

    chunk* write_chunk = NULL;
    uint64_t bytes_written = 0;
    uint64_t bytes_to_write = 0;
    uint64_t write_progress = 0;

    while(*(params->running) && *(params->error) == 0)
    {
        if(write_chunk == NULL) //Get a chunk from the queue
        {
            pthread_mutex_lock(params->mutex);
            if(front(params->in) != NULL)
            {
                write_chunk = front(params->in);
                if(write_chunk != NULL) { deque(params->in); }
            }
            pthread_mutex_unlock(params->mutex);
        }

        //check for termination conditions
        if((write_chunk != NULL && write_chunk->action == DONE) || 
            ((params->file_size) != NULL &&
            *(params->valid) && 
            bytes_written >= *(params->file_size))) 
            //size constraints
        {
            pdebug("^^^^ AsyncWrite() terminating loop ^^^^\n");
            destroyChunk(write_chunk);
            break;
        }

        if(write_chunk != NULL && write_chunk->data != NULL)
        {
            //ensure we aren't writing padding or attack attempts
            if(params->file_size == NULL) { bytes_to_write = write_chunk->data_size; }
            else if(bytes_written + write_chunk->data_size > *(params->file_size))
            { bytes_to_write = *(params->file_size) - bytes_written; }
            else { bytes_to_write = write_chunk->data_size; }

            write_progress += write_chunk->data_size;

            if(!writeBytes((uint8_t*)write_chunk->data, bytes_to_write, write))
            {
                pdebug("^^^^ File I/O Error ^^^^\n");
                *(params->error) = FILE_IO_FAIL;
		        close(write);
                break;
            }
            
            ///write it to the file
            pdebug("^^^^ Writing a chunk of size %lu ^^^^\n", bytes_to_write);
            bytes_written += bytes_to_write;
            destroyChunk(write_chunk); //free the chunk
            write_chunk = NULL; 
        }
        
        if(write_progress > 0) //update the progress bar
	    {
	        if(pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	        {
	            params->progress->progress += write_progress;
		        write_progress = 0;
		        pthread_mutex_unlock(params->progress->progress_mutex);
	        }
	    }	
    }
    
    close(write);

    if(*(params->error) == 0)
    {
        if(params->args->rename) //change the output file to what the user wanted
        { rename((char*)params->temp_file_name, (char*)params->args->rename_file); }
        else //rename the temp file to the original file name (replaces file)
        { rename((char*)params->temp_file_name, (char*)params->args->target_file); }

        //signal any other running threads to stop (in case they are stuck)
        *(params->running) = false;
    }
    
    pdebug("^^^^ writeThread Done ^^^^\n");
    //we are done
    return NULL;  
}